

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_tt_PackSetOversampling(nk_tt_pack_context *spc,uint h_oversample,uint v_oversample)

{
  if (8 < h_oversample) {
    __assert_fail("h_oversample <= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2aa4,
                  "void nk_tt_PackSetOversampling(struct nk_tt_pack_context *, unsigned int, unsigned int)"
                 );
  }
  if (v_oversample < 9) {
    spc->h_oversample = h_oversample;
    spc->v_oversample = v_oversample;
    return;
  }
  __assert_fail("v_oversample <= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x2aa5,
                "void nk_tt_PackSetOversampling(struct nk_tt_pack_context *, unsigned int, unsigned int)"
               );
}

Assistant:

NK_INTERN void
nk_tt_PackSetOversampling(struct nk_tt_pack_context *spc,
    unsigned int h_oversample, unsigned int v_oversample)
{
   NK_ASSERT(h_oversample <= NK_TT_MAX_OVERSAMPLE);
   NK_ASSERT(v_oversample <= NK_TT_MAX_OVERSAMPLE);
   if (h_oversample <= NK_TT_MAX_OVERSAMPLE)
      spc->h_oversample = h_oversample;
   if (v_oversample <= NK_TT_MAX_OVERSAMPLE)
      spc->v_oversample = v_oversample;
}